

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 __s;
  bool bVar1;
  int iVar2;
  char *__s_00;
  undefined1 local_568 [208];
  undefined1 local_498 [208];
  undefined1 local_3c8 [208];
  undefined1 local_2f8 [215];
  allocator<char> local_221;
  string local_220 [32];
  string local_200 [108];
  undefined1 local_194 [8];
  EssenceType_t EssenceType;
  FileReaderFactory local_128 [8];
  FileReaderFactory defaultFactory;
  undefined1 local_110 [8];
  CommandOptions Options;
  Result_t result;
  char **argv_local;
  int argc_local;
  
  Kumu::Result_t::Result_t((Result_t *)&Options.extension,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions((CommandOptions *)local_110,argc,argv);
  if ((Options.verbose_flag & 1U) != 0) {
    banner(_stdout);
  }
  if ((Options._10_1_ & 1) != 0) {
    usage(_stdout);
  }
  if (((Options.verbose_flag & 1U) != 0) || ((Options._10_1_ & 1) != 0)) {
    argv_local._4_4_ = 0;
    _defaultFactory = 1;
    goto LAB_00111075;
  }
  if ((local_110[4] & 1U) != 0) {
    fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
    argv_local._4_4_ = 3;
    _defaultFactory = 1;
    goto LAB_00111075;
  }
  Kumu::FileReaderFactory::FileReaderFactory(local_128);
  __s = Options._88_8_;
  if (local_110._0_4_ == MMT_GOP_START) {
    gop_start_test((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)local_110);
    Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)(local_194 + 4));
    Kumu::Result_t::~Result_t((Result_t *)(local_194 + 4));
LAB_00110f4a:
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Options.extension);
    if (iVar2 < 0) {
      fputs("Program stopped on error.\n",_stderr);
      bVar1 = Kumu::Result_t::operator==
                        ((Result_t *)&Options.extension,(Result_t *)ASDCP::RESULT_SFORMAT);
      if (bVar1) {
        fputs("Use option \'-3\' to force stereoscopic mode.\n",_stderr);
      }
      else {
        bVar1 = Kumu::Result_t::operator!=
                          ((Result_t *)&Options.extension,(Result_t *)Kumu::RESULT_FAIL);
        if (bVar1) {
          __s_00 = Kumu::Result_t::operator_cast_to_char_((Result_t *)&Options.extension);
          fputs(__s_00,_stderr);
          fputc(10,_stderr);
        }
      }
      argv_local._4_4_ = 1;
    }
    else {
      argv_local._4_4_ = 0;
    }
  }
  else {
    if (local_110._0_4_ == MMT_EXTRACT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_220,(char *)__s,&local_221);
      ASDCP::EssenceType(local_200,(EssenceType_t *)local_220,(IFileReaderFactory *)local_194);
      Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)local_200);
      Kumu::Result_t::~Result_t((Result_t *)local_200);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator(&local_221);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Options.extension);
      if (-1 < iVar2) {
        switch(local_194._0_4_) {
        case 1:
          read_MPEG2_file((CommandOptions *)(local_2f8 + 0x68),(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)(local_2f8 + 0x68));
          Kumu::Result_t::~Result_t((Result_t *)(local_2f8 + 0x68));
          break;
        case 2:
          if ((Options._11_1_ & 1) == 0) {
            read_JP2K_file((CommandOptions *)(local_3c8 + 0x68),(IFileReaderFactory *)local_110);
            Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)(local_3c8 + 0x68))
            ;
            Kumu::Result_t::~Result_t((Result_t *)(local_3c8 + 0x68));
          }
          else {
            read_JP2K_S_file((CommandOptions *)local_2f8,(IFileReaderFactory *)local_110);
            Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)local_2f8);
            Kumu::Result_t::~Result_t((Result_t *)local_2f8);
          }
          break;
        case 3:
        case 4:
          read_PCM_file((CommandOptions *)(local_498 + 0x68),(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)(local_498 + 0x68));
          Kumu::Result_t::~Result_t((Result_t *)(local_498 + 0x68));
          break;
        case 5:
          read_timed_text_file((CommandOptions *)local_498,(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)local_498);
          Kumu::Result_t::~Result_t((Result_t *)local_498);
          break;
        case 6:
          read_JP2K_S_file((CommandOptions *)local_3c8,(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)local_3c8);
          Kumu::Result_t::~Result_t((Result_t *)local_3c8);
          break;
        case 7:
          read_DCData_file((CommandOptions *)(local_568 + 0x68),(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)(local_568 + 0x68));
          Kumu::Result_t::~Result_t((Result_t *)(local_568 + 0x68));
          break;
        case 8:
          Options.prefix_buffer.field_2._8_8_ = anon_var_dwarf_1b88;
          read_DCData_file((CommandOptions *)local_568,(IFileReaderFactory *)local_110);
          Kumu::Result_t::operator=((Result_t *)&Options.extension,(Result_t *)local_568);
          Kumu::Result_t::~Result_t((Result_t *)local_568);
          break;
        default:
          fprintf(_stderr,"%s: Unknown file type, not ASDCP essence.\n",Options._88_8_);
          argv_local._4_4_ = 5;
          goto LAB_00111059;
        }
      }
      goto LAB_00110f4a;
    }
    fprintf(_stderr,"Unhandled mode: %d.\n",(ulong)(uint)local_110._0_4_);
    argv_local._4_4_ = 6;
  }
LAB_00111059:
  _defaultFactory = 1;
  Kumu::FileReaderFactory::~FileReaderFactory(local_128);
LAB_00111075:
  CommandOptions::~CommandOptions((CommandOptions *)local_110);
  Kumu::Result_t::~Result_t((Result_t *)&Options.extension);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::FileReaderFactory defaultFactory;

  if ( Options.mode == MMT_GOP_START )
    {
      result = gop_start_test(Options, defaultFactory);
    }
  else if ( Options.mode == MMT_EXTRACT )
    {
      EssenceType_t EssenceType;
      result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

      if ( ASDCP_SUCCESS(result) )
	{
	  switch ( EssenceType )
	    {
	    case ESS_MPEG2_VES:
          result = read_MPEG2_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000:
	      if ( Options.stereo_image_flag )
        result = read_JP2K_S_file(Options, defaultFactory);
	      else
        result = read_JP2K_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000_S:
          result = read_JP2K_S_file(Options, defaultFactory);
	      break;

	    case ESS_PCM_24b_48k:
	    case ESS_PCM_24b_96k:
          result = read_PCM_file(Options, defaultFactory);
	      break;

	    case ESS_TIMED_TEXT:
          result = read_timed_text_file(Options, defaultFactory);
	      break;

        case ESS_DCDATA_UNKNOWN:
          result = read_DCData_file(Options, defaultFactory);
          break;

        case ESS_DCDATA_DOLBY_ATMOS:
          Options.extension = "atmos";
          result = read_DCData_file(Options, defaultFactory);
          break;

	    default:
	      fprintf(stderr, "%s: Unknown file type, not ASDCP essence.\n", Options.input_filename);
	      return 5;
	    }
	}
    }
  else
    {
      fprintf(stderr, "Unhandled mode: %d.\n", Options.mode);
      return 6;
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result == RESULT_SFORMAT )
	{
	  fputs("Use option '-3' to force stereoscopic mode.\n", stderr);
	}
      else if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}